

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::GLMClassifier_DoubleArray::InternalSwap
          (GLMClassifier_DoubleArray *this,GLMClassifier_DoubleArray *other)

{
  intptr_t iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar5 = (this->value_).current_size_;
  iVar6 = (this->value_).total_size_;
  pvVar2 = (this->value_).arena_or_elements_;
  iVar4 = (other->value_).total_size_;
  pvVar3 = (other->value_).arena_or_elements_;
  (this->value_).current_size_ = (other->value_).current_size_;
  (this->value_).total_size_ = iVar4;
  (this->value_).arena_or_elements_ = pvVar3;
  (other->value_).current_size_ = iVar5;
  (other->value_).total_size_ = iVar6;
  (other->value_).arena_or_elements_ = pvVar2;
  return;
}

Assistant:

void GLMClassifier_DoubleArray::InternalSwap(GLMClassifier_DoubleArray* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  value_.InternalSwap(&other->value_);
}